

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

GraphId __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::GetId(GraphCycles *this,void *ptr)

{
  Rep *pRVar1;
  Node **ppNVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  GraphId GVar6;
  Node *pNVar7;
  
  pRVar1 = this->rep_;
  uVar3 = anon_unknown_0::PointerMap::Find(&pRVar1->ptrmap_,ptr);
  if (uVar3 == 0xffffffff) {
    uVar5 = (pRVar1->free_nodes_).size_;
    if (uVar5 == 0) {
      pNVar7 = (Node *)base_internal::LowLevelAlloc::AllocWithArena
                                 (0x1d0,(anonymous_namespace)::arena);
      anon_unknown_0::NodeSet::NodeSet(&pNVar7->in);
      anon_unknown_0::NodeSet::NodeSet(&pNVar7->out);
      pNVar7->version = 1;
      pNVar7->visited = false;
      pRVar1 = this->rep_;
      uVar3 = (pRVar1->nodes_).size_;
      pNVar7->rank = uVar3;
      pNVar7->masked_ptr = (ulong)ptr ^ 0xf03a5f7bf03a5f7b;
      pNVar7->priority = 0;
      pNVar7->nstack = 0;
      uVar5 = uVar3;
      if (uVar3 == (pRVar1->nodes_).capacity_) {
        anon_unknown_0::
        Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::Grow
                  (&pRVar1->nodes_,uVar3 + 1);
        uVar3 = pNVar7->rank;
        uVar5 = (pRVar1->nodes_).size_;
      }
      (pRVar1->nodes_).ptr_[uVar5] = pNVar7;
      (pRVar1->nodes_).size_ = uVar5 + 1;
      pRVar1 = this->rep_;
      ((pRVar1->ptrmap_).nodes_)->ptr_[uVar3]->next_hash =
           (pRVar1->ptrmap_).table_._M_elems[(ulong)ptr % 0x3fffb];
      (pRVar1->ptrmap_).table_._M_elems[(ulong)ptr % 0x3fffb] = uVar3;
      GVar6.handle._0_4_ = pNVar7->rank;
      GVar6.handle._4_4_ = pNVar7->version;
    }
    else {
      ppNVar2 = (pRVar1->nodes_).ptr_;
      uVar4 = uVar5 - 1;
      uVar3 = (pRVar1->free_nodes_).ptr_[uVar4];
      (pRVar1->free_nodes_).size_ = uVar4;
      pNVar7 = ppNVar2[uVar3];
      pNVar7->masked_ptr = (ulong)ptr ^ 0xf03a5f7bf03a5f7b;
      pNVar7->priority = 0;
      pNVar7->nstack = 0;
      ((pRVar1->ptrmap_).nodes_)->ptr_[uVar3]->next_hash =
           (pRVar1->ptrmap_).table_._M_elems[(ulong)ptr % 0x3fffb];
      (pRVar1->ptrmap_).table_._M_elems[(ulong)ptr % 0x3fffb] = uVar3;
      GVar6.handle = CONCAT44(pNVar7->version,uVar3);
    }
  }
  else {
    GVar6.handle = CONCAT44((pRVar1->nodes_).ptr_[uVar3]->version,uVar3);
  }
  return (GraphId)GVar6.handle;
}

Assistant:

GraphId GraphCycles::GetId(void* ptr) {
  int32_t i = rep_->ptrmap_.Find(ptr);
  if (i != -1) {
    return MakeId(i, rep_->nodes_[static_cast<uint32_t>(i)]->version);
  } else if (rep_->free_nodes_.empty()) {
    Node* n =
        new (base_internal::LowLevelAlloc::AllocWithArena(sizeof(Node), arena))
            Node;
    n->version = 1;  // Avoid 0 since it is used by InvalidGraphId()
    n->visited = false;
    n->rank = static_cast<int32_t>(rep_->nodes_.size());
    n->masked_ptr = base_internal::HidePtr(ptr);
    n->nstack = 0;
    n->priority = 0;
    rep_->nodes_.push_back(n);
    rep_->ptrmap_.Add(ptr, n->rank);
    return MakeId(n->rank, n->version);
  } else {
    // Preserve preceding rank since the set of ranks in use must be
    // a permutation of [0,rep_->nodes_.size()-1].
    int32_t r = rep_->free_nodes_.back();
    rep_->free_nodes_.pop_back();
    Node* n = rep_->nodes_[static_cast<uint32_t>(r)];
    n->masked_ptr = base_internal::HidePtr(ptr);
    n->nstack = 0;
    n->priority = 0;
    rep_->ptrmap_.Add(ptr, r);
    return MakeId(r, n->version);
  }
}